

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

KeyData * __thiscall
cfd::core::Psbt::GetTxInKeyData
          (KeyData *__return_storage_ptr__,Psbt *this,uint32_t index,bool ignore_error)

{
  bool bVar1;
  reference pvVar2;
  CfdException *this_00;
  allocator local_81;
  string local_80;
  CfdSourceLocation local_60;
  undefined4 local_48;
  undefined1 local_38 [8];
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> keys;
  bool ignore_error_local;
  uint32_t index_local;
  Psbt *this_local;
  
  keys.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = ignore_error;
  keys.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = index;
  GetTxInKeyDataList((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_38,
                     this,index);
  bVar1 = ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::empty
                    ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_38);
  if (bVar1) {
    if ((keys.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
      local_60.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_60.filename = local_60.filename + 1;
      local_60.line = 0xa8b;
      local_60.funcname = "GetTxInKeyData";
      logger::warn<>(&local_60,"key not found.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_80,"psbt key not found error.",&local_81);
      CfdException::CfdException(this_00,kCfdIllegalStateError,&local_80);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    KeyData::KeyData(__return_storage_ptr__);
  }
  else {
    pvVar2 = ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::operator[]
                       ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_38,
                        0);
    KeyData::KeyData(__return_storage_ptr__,pvVar2);
  }
  local_48 = 1;
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

KeyData Psbt::GetTxInKeyData(uint32_t index, bool ignore_error) const {
  std::vector<KeyData> keys = GetTxInKeyDataList(index);
  if (!keys.empty()) {
    return keys[0];
  } else if (ignore_error) {
    return KeyData();
  } else {
    warn(CFD_LOG_SOURCE, "key not found.");
    throw CfdException(kCfdIllegalStateError, "psbt key not found error.");
  }
}